

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

void __thiscall leveldb::Table::ReadMeta(Table *this,Footer *footer)

{
  Rep *pRVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  Block *this_00;
  Comparator *comparator;
  Iterator *pIVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Slice local_80;
  ReadOptions opt;
  string key;
  BlockContents contents;
  Slice local_28;
  
  pRVar1 = this->rep_;
  if ((pRVar1->options).filter_policy != (FilterPolicy *)0x0) {
    opt.verify_checksums = false;
    opt.fill_cache = true;
    opt.snapshot = (Snapshot *)0x0;
    if ((pRVar1->options).paranoid_checks == true) {
      opt.verify_checksums = true;
      opt.fill_cache = true;
    }
    contents.data.data_ = "";
    contents.data.size_ = 0;
    ReadBlock((leveldb *)&key,pRVar1->file,&opt,&footer->metaindex_handle_,&contents);
    lVar2 = CONCAT44(key._M_dataplus._M_p._4_4_,key._M_dataplus._M_p._0_4_);
    Status::~Status((Status *)&key);
    if (lVar2 == 0) {
      this_00 = (Block *)operator_new(0x18);
      Block::Block(this_00,&contents);
      comparator = BytewiseComparator();
      pIVar5 = Block::NewIterator(this_00,comparator);
      std::__cxx11::string::string((string *)&key,"filter.",(allocator *)&local_80);
      (*((this->rep_->options).filter_policy)->_vptr_FilterPolicy[2])();
      std::__cxx11::string::append((char *)&key);
      local_80.data_ = (char *)CONCAT44(key._M_dataplus._M_p._4_4_,key._M_dataplus._M_p._0_4_);
      (*pIVar5->_vptr_Iterator[5])(pIVar5);
      iVar4 = (*pIVar5->_vptr_Iterator[2])(pIVar5);
      if ((char)iVar4 != '\0') {
        iVar4 = (*pIVar5->_vptr_Iterator[8])(pIVar5);
        local_80.data_ = (char *)CONCAT44(extraout_var,iVar4);
        bVar3 = operator==(&local_80,&local_28);
        if (bVar3) {
          iVar4 = (*pIVar5->_vptr_Iterator[9])(pIVar5);
          local_80.data_ = (char *)CONCAT44(extraout_var_00,iVar4);
          ReadFilter(this,&local_80);
        }
      }
      (*pIVar5->_vptr_Iterator[1])(pIVar5);
      Block::~Block(this_00);
      operator_delete(this_00);
      std::__cxx11::string::~string((string *)&key);
    }
  }
  return;
}

Assistant:

void Table::ReadMeta(const Footer& footer) {
  if (rep_->options.filter_policy == nullptr) {
    return;  // Do not need any metadata
  }

  // TODO(sanjay): Skip this if footer.metaindex_handle() size indicates
  // it is an empty block.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents contents;
  if (!ReadBlock(rep_->file, opt, footer.metaindex_handle(), &contents).ok()) {
    // Do not propagate errors since meta info is not needed for operation
    return;
  }
  Block* meta = new Block(contents);

  Iterator* iter = meta->NewIterator(BytewiseComparator());
  std::string key = "filter.";
  key.append(rep_->options.filter_policy->Name());
  iter->Seek(key);
  if (iter->Valid() && iter->key() == Slice(key)) {
    ReadFilter(iter->value());
  }
  delete iter;
  delete meta;
}